

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O0

void __thiscall
Shm::Shm(Shm *this,int rank,int n_processes,int n_partners,int message_size,bool lock_each_iteration
        )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  ulong uVar5;
  void *pvVar6;
  int in_ECX;
  undefined8 *in_RDI;
  int in_R8D;
  byte in_R9B;
  int i_1;
  int i;
  int ignore_disp_unit;
  MPI_Aint ignore_size;
  MPI_Group shared_group;
  MPI_Group world_group;
  int local_54;
  int local_50;
  undefined1 local_4c [4];
  undefined1 local_48 [8];
  undefined8 local_40;
  undefined8 local_38;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar4 = in_R9B & 1;
  HalosExchange::HalosExchange
            ((HalosExchange *)(CONCAT17(in_R9B,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__Shm_00118ce0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  *(int *)(in_RDI + 8) = in_R8D;
  *(byte *)((long)in_RDI + 0x6c) = bVar4 & 1;
  MPI_Comm_split_type(&ompi_mpi_comm_world,0,0,&ompi_mpi_info_null,in_RDI + 9);
  MPI_Win_allocate_shared((long)in_R8D,8,&ompi_mpi_info_null,in_RDI[9],in_RDI + 4,in_RDI + 10);
  MPI_Comm_group(&ompi_mpi_comm_world,&local_38);
  MPI_Comm_group(in_RDI[9],&local_40);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  in_RDI[0xb] = pvVar6;
  MPI_Group_translate_ranks(local_38,in_ECX,in_RDI[2],local_40,in_RDI[0xb]);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ECX;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  in_RDI[0xc] = pvVar6;
  for (local_50 = 0; local_50 < in_ECX; local_50 = local_50 + 1) {
    *(undefined8 *)(in_RDI[0xc] + (long)local_50 * 8) = 0;
    if (*(int *)(in_RDI[0xb] + (long)local_50 * 4) != -0x7ffe) {
      MPI_Win_shared_query
                (in_RDI[10],*(undefined4 *)(in_RDI[0xb] + (long)local_50 * 4),local_48,local_4c,
                 in_RDI[0xc] + (long)local_50 * 8);
    }
  }
  *(undefined4 *)(in_RDI + 0xd) = 0;
  for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
    if (*(int *)(in_RDI[0xb] + (long)local_54 * 4) == -0x7ffe) {
      *(int *)(in_RDI + 0xd) = *(int *)(in_RDI + 0xd) + 1;
    }
  }
  if (0 < *(int *)(in_RDI + 0xd)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(*(int *)(in_RDI + 0xd) * 2);
    uVar5 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pvVar6 = operator_new__(uVar5);
    in_RDI[7] = pvVar6;
  }
  return;
}

Assistant:

Shm(int rank, int n_processes, int n_partners, int message_size,
        bool lock_each_iteration) : HalosExchange(rank, n_processes, n_partners,
                                                  message_size)
    {
        this->message_size = message_size;
        this->lock_each_iteration = lock_each_iteration;
        // MPI_Comm_split_type will split the processes into disjointed subgroups
        // located on the same node. A new (shared memory) communicator is created
        // for each subgroup and returned in shmcomm.
        MPI_Comm_split_type(MPI_COMM_WORLD, MPI_COMM_TYPE_SHARED, 0,
                            MPI_INFO_NULL, &shmcomm);
        // MPI_Win_allocate_shared will create a window object with shared memory.
        // On each process, it allocates memory of message_size bytes that is shared
        // among all processes in shmcomm. The allocated memory is contiguous
        // across process ranks, which means that the first address in the memory
        // segment of process i is consecutive with the last address in the memory
        // segment of process i−1.
        MPI_Win_allocate_shared(message_size, sizeof(double), MPI_INFO_NULL,
                                shmcomm, &sbuf, &win);
        // We need to distinguish between processes located on the same node and
        // processes belonging to other nodes. Let us first create a global and
        // a shared MPI group.
        MPI_Group world_group, shared_group;
        MPI_Comm_group(MPI_COMM_WORLD, &world_group);
        MPI_Comm_group(shmcomm, &shared_group);
        // We can now map global ranks to shmcomm ranks via MPI_Group_translate_ranks.
        partners_map = new int[n_partners];
        MPI_Group_translate_ranks(world_group, n_partners, partners,
                                  shared_group, partners_map);
        // In order to exploit shared memory, we need to find out the local address
        // of each shared memory segment. MPI_Win_shared_query will return the base
        // pointer in this process' address space of the shared segment belonging
        // to a given target rank.
        partners_ptrs = new int*[n_partners];
        // MPI_Win_shared_query returns the local size and local displacement
        // size too, but we will ignore them.
        MPI_Aint ignore_size;
        int ignore_disp_unit;
        for (int i = 0; i < n_partners; i++)
        {
            partners_ptrs[i] = nullptr;
            if (partners_map[i] != MPI_UNDEFINED)
                MPI_Win_shared_query(win, partners_map[i], &ignore_size,
                                     &ignore_disp_unit, &partners_ptrs[i]);
        }
        // Let us compute the number of inter-node partners.
        n_inter_partners = 0;
        for (int i = 0; i < n_partners; i++)
            if (partners_map[i] == MPI_UNDEFINED) n_inter_partners++;
        if (n_inter_partners > 0)
            reqs = new MPI_Request[2 * n_inter_partners];
    }